

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

bool __thiscall
mp::internal::TextReader<fmt::Locale>::DoReadOptionalInt<short>
          (TextReader<fmt::Locale> *this,short *value)

{
  bool bVar1;
  ushort *in_RSI;
  TextReader<fmt::Locale> *in_RDI;
  CStringRef unaff_retaddr;
  UInt max;
  UInt result;
  char sign;
  BasicCStringRef<char> local_28;
  ushort local_1e;
  ushort local_1c;
  char local_19;
  ushort *local_18;
  TextReader<fmt::Locale> *value_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_18 = in_RSI;
  value_00 = in_RDI;
  SkipSpace(in_RDI);
  local_19 = *(in_RDI->super_ReaderBase).ptr_;
  if ((local_19 == '+') || (local_19 == '-')) {
    (in_RDI->super_ReaderBase).ptr_ = (in_RDI->super_ReaderBase).ptr_ + 1;
  }
  local_1c = 0;
  bVar1 = ReadIntWithoutSign<unsigned_short>
                    ((TextReader<fmt::Locale> *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     (unsigned_short *)value_00);
  if (bVar1) {
    local_1e = std::numeric_limits<short>::max();
    if ((local_1e < local_1c) && ((local_19 != '-' || ((uint)local_1c != local_1e + 1)))) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_28,"number is too big");
      ReportError<>((TextReader<fmt::Locale> *)
                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),unaff_retaddr);
    }
    if (local_19 == '-') {
      local_1c = -local_1c;
    }
    *local_18 = local_1c;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DoReadOptionalInt(Int &value) {
    SkipSpace();
    char sign = *ptr_;
    if (sign == '+' || sign == '-')
      ++ptr_;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    if (!ReadIntWithoutSign<UInt>(result))
      return false;
    UInt max = std::numeric_limits<Int>::max();
    if (result > max && !(sign == '-' && result == max + 1))
      ReportError("number is too big");
    value = sign != '-' ? result : 0 - result;
    return true;
  }